

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  aiString *this_00;
  bool bVar1;
  int iVar2;
  MetaKeyPairVector *key_renaming_00;
  undefined4 extraout_var;
  char *pcVar3;
  const_reference pvVar4;
  size_type local_498;
  size_t found_index;
  string camel_key_str;
  aiString aistr;
  char *value_char;
  allocator<char> local_49;
  string local_48 [8];
  string key_str;
  char *key_char;
  MetaKeyPairVector *key_renaming;
  StringMetaData *metadata_local;
  ColladaParser *this_local;
  
  key_renaming_00 = Collada::GetColladaAssimpMetaKeysCamelCase_abi_cxx11_();
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  key_str.field_2._8_8_ = pcVar3;
  if (pcVar3 == (char *)0x0) {
    SkipElement(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar3,&local_49);
    std::allocator<char>::~allocator(&local_49);
    pcVar3 = TestTextContent(this);
    if (pcVar3 != (char *)0x0) {
      this_00 = (aiString *)((long)&camel_key_str.field_2 + 0xc);
      aiString::aiString(this_00);
      aiString::Set(this_00,pcVar3);
      std::__cxx11::string::string((string *)&found_index,local_48);
      Collada::ToCamelCase((string *)&found_index);
      bVar1 = FindCommonKey((string *)&found_index,key_renaming_00,&local_498);
      if (bVar1) {
        pvVar4 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](key_renaming_00,local_498);
        std::
        map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
        ::emplace<std::__cxx11::string_const&,aiString&>
                  ((map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                    *)metadata,&pvVar4->second,(aiString *)((long)&camel_key_str.field_2 + 0xc));
      }
      else {
        std::
        map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
        ::emplace<std::__cxx11::string&,aiString&>
                  ((map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                    *)metadata,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&found_index
                   ,(aiString *)((long)&camel_key_str.field_2 + 0xc));
      }
      std::__cxx11::string::~string((string *)&found_index);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    TestClosing(this,pcVar3);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata) {
    const Collada::MetaKeyPairVector &key_renaming = GetColladaAssimpMetaKeysCamelCase();
	// Metadata such as created, keywords, subject etc
	const char *key_char = mReader->getNodeName();
	if (key_char != nullptr) {
        const std::string key_str(key_char);
		const char *value_char = TestTextContent();
		if (value_char != nullptr) {
            aiString aistr;
			aistr.Set(value_char);

            std::string camel_key_str(key_str);
			ToCamelCase(camel_key_str);

			size_t found_index;
			if (FindCommonKey(camel_key_str, key_renaming, found_index)) {
                metadata.emplace(key_renaming[found_index].second, aistr);
            } else {
				metadata.emplace(camel_key_str, aistr);
			}
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}